

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O0

ze_result_t driver::zeFenceReset(ze_fence_handle_t hFence)

{
  ze_pfnFenceReset_t pfnReset;
  ze_result_t result;
  ze_fence_handle_t hFence_local;
  
  pfnReset._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c588 != (code *)0x0) {
    pfnReset._4_4_ = (*DAT_0011c588)(hFence);
  }
  return pfnReset._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeFenceReset(
        ze_fence_handle_t hFence                        ///< [in] handle of the fence
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnReset = context.zeDdiTable.Fence.pfnReset;
        if( nullptr != pfnReset )
        {
            result = pfnReset( hFence );
        }
        else
        {
            // generic implementation
        }

        return result;
    }